

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::HeapDisposer<kj::EventLoop::LocalMap>::disposeImpl
          (HeapDisposer<kj::EventLoop::LocalMap> *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<kj::EventLoop::LocalMap> *this_local;
  
  if (pointer != (void *)0x0) {
    EventLoop::LocalMap::~LocalMap((LocalMap *)pointer);
    operator_delete(pointer,0x48);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }